

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataItem.cpp
# Opt level: O0

void __thiscall DataItem::DataItem(DataItem *this,int v)

{
  int v_local;
  DataItem *this_local;
  
  this->value = v;
  std::set<Transaction_*,_TransCompare,_std::allocator<Transaction_*>_>::set(&this->read_list);
  std::mutex::mutex(&this->lock);
  return;
}

Assistant:

DataItem::DataItem(int v): value(v) {}